

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlValidityError(xmlParserCtxtPtr ctxt,xmlParserErrors error,char *msg,xmlChar *str1,
                     xmlChar *str2)

{
  xmlStructuredErrorFunc local_58;
  xmlStructuredErrorFunc schannel;
  xmlChar *str2_local;
  xmlChar *str1_local;
  char *msg_local;
  xmlParserErrors error_local;
  xmlParserCtxtPtr ctxt_local;
  
  local_58 = (xmlStructuredErrorFunc)0x0;
  if (((ctxt == (xmlParserCtxtPtr)0x0) || (ctxt->disableSAX == 0)) ||
     (ctxt->instate != XML_PARSER_EOF)) {
    if (((ctxt != (xmlParserCtxtPtr)0x0) &&
        (ctxt->errNo = error, ctxt->sax != (_xmlSAXHandler *)0x0)) &&
       (ctxt->sax->initialized == 0xdeedbeaf)) {
      local_58 = ctxt->sax->serror;
    }
    if (ctxt == (xmlParserCtxtPtr)0x0) {
      __xmlRaiseError(local_58,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,(void *)0x0,4,error,
                      XML_ERR_ERROR,(char *)0x0,0,(char *)str1,(char *)str2,(char *)0x0,0,0,msg,str1
                      ,str2);
    }
    else {
      __xmlRaiseError(local_58,(ctxt->vctxt).error,(ctxt->vctxt).userData,ctxt,(void *)0x0,4,error,
                      XML_ERR_ERROR,(char *)0x0,0,(char *)str1,(char *)str2,(char *)0x0,0,0,msg,str1
                      ,str2);
      ctxt->valid = 0;
    }
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(3,0)
xmlValidityError(xmlParserCtxtPtr ctxt, xmlParserErrors error,
              const char *msg, const xmlChar *str1, const xmlChar *str2)
{
    xmlStructuredErrorFunc schannel = NULL;

    if ((ctxt != NULL) && (ctxt->disableSAX != 0) &&
        (ctxt->instate == XML_PARSER_EOF))
	return;
    if (ctxt != NULL) {
	ctxt->errNo = error;
	if ((ctxt->sax != NULL) && (ctxt->sax->initialized == XML_SAX2_MAGIC))
	    schannel = ctxt->sax->serror;
    }